

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXAnimation.cpp
# Opt level: O3

void __thiscall
Assimp::FBX::AnimationCurveNode::AnimationCurveNode
          (AnimationCurveNode *this,uint64_t id,Element *element,string *name,Document *doc,
          char **target_prop_whitelist,size_t whitelist_size)

{
  _Rb_tree_header *p_Var1;
  Connection *this_00;
  char *__s1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  Document *doc_00;
  int iVar4;
  Object *pOVar5;
  range_error *this_02;
  size_t sVar6;
  pointer ppCVar7;
  char *whitelist [3];
  string local_d0;
  Element *local_b0;
  string *local_a8;
  Object **local_a0;
  string *local_98;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> local_90
  ;
  element_type *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  Scope *local_60;
  Document *local_58;
  pointer local_50;
  char *local_48;
  char *pcStack_40;
  char *local_38;
  
  Object::Object(&this->super_Object,id,element,name);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__AnimationCurveNode_008cea60;
  p_Var1 = &(this->curves)._M_t._M_impl.super__Rb_tree_header;
  (this->curves)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->curves)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this->target = (Object *)0x0;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->curves)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->curves)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->curves)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8 = (string *)&this->prop;
  (this->prop)._M_dataplus._M_p = (pointer)&(this->prop).field_2;
  (this->prop)._M_string_length = 0;
  (this->prop).field_2._M_local_buf[0] = '\0';
  this->doc = doc;
  local_b0 = element;
  local_60 = GetRequiredScope(element);
  local_38 = "Deformer";
  local_48 = "Model";
  pcStack_40 = "NodeAttribute";
  local_58 = doc;
  Document::GetConnectionsBySourceSequenced(&local_90,doc,(this->super_Object).id,&local_48,3);
  local_a0 = &this->target;
  local_50 = local_90.
             super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  ppCVar7 = local_90.
            super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_90.
      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_90.
      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      this_00 = *ppCVar7;
      if ((this_00->prop)._M_string_length != 0) {
        local_98 = &this_00->prop;
        if (target_prop_whitelist != (char **)0x0) {
          if (whitelist_size == 0) {
LAB_005fa03f:
            this_02 = (range_error *)__cxa_allocate_exception(0x10);
            std::range_error::range_error
                      (this_02,"AnimationCurveNode target property is not in whitelist");
            __cxa_throw(this_02,&std::range_error::typeinfo,std::range_error::~range_error);
          }
          __s1 = (local_98->_M_dataplus)._M_p;
          sVar6 = 0;
          while (iVar4 = strcmp(__s1,target_prop_whitelist[sVar6]), iVar4 != 0) {
            sVar6 = sVar6 + 1;
            if (whitelist_size == sVar6) goto LAB_005fa03f;
          }
        }
        pOVar5 = Connection::DestinationObject(this_00);
        if (pOVar5 != (Object *)0x0) {
          *local_a0 = pOVar5;
          std::__cxx11::string::_M_assign(local_a8);
          break;
        }
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,
                   "failed to read destination object for AnimationCurveNode->Model link, ignoring",
                   "");
        Util::DOMWarning(&local_d0,local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
      }
      ppCVar7 = ppCVar7 + 1;
    } while (ppCVar7 != local_50);
  }
  doc_00 = local_58;
  if (*local_a0 == (Object *)0x0) {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,
               "failed to resolve target Model/NodeAttribute/Constraint for AnimationCurveNode","");
    Util::DOMWarning(&local_d0,local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,"AnimationCurveNode.FbxAnimCurveNode","");
  Util::GetPropertyTable((Util *)&local_78,doc_00,&local_d0,local_b0,local_60,false);
  p_Var3 = p_Stack_70;
  peVar2 = local_78;
  local_78 = (element_type *)0x0;
  p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_01 = (this->props).
            super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar2;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var3;
  if ((this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01),
     p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_90.
      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.
                    super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.
                          super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.
                          super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

AnimationCurveNode::AnimationCurveNode(uint64_t id, const Element& element, const std::string& name, 
        const Document& doc, const char* const * target_prop_whitelist /*= NULL*/, 
        size_t whitelist_size /*= 0*/)
: Object(id, element, name)
, target()
, doc(doc)
{
    const Scope& sc = GetRequiredScope(element);

    // find target node
    const char* whitelist[] = {"Model","NodeAttribute","Deformer"};
    const std::vector<const Connection*>& conns = doc.GetConnectionsBySourceSequenced(ID(),whitelist,3);

    for(const Connection* con : conns) {

        // link should go for a property
        if (!con->PropertyName().length()) {
            continue;
        }

        if(target_prop_whitelist) {
            const char* const s = con->PropertyName().c_str();
            bool ok = false;
            for (size_t i = 0; i < whitelist_size; ++i) {
                if (!strcmp(s, target_prop_whitelist[i])) {
                    ok = true;
                    break;
                }
            }

            if (!ok) {
                throw std::range_error("AnimationCurveNode target property is not in whitelist");
            }
        }

        const Object* const ob = con->DestinationObject();
        if(!ob) {
            DOMWarning("failed to read destination object for AnimationCurveNode->Model link, ignoring",&element);
            continue;
        }

        // XXX support constraints as DOM class
        //ai_assert(dynamic_cast<const Model*>(ob) || dynamic_cast<const NodeAttribute*>(ob));
        target = ob;
        if(!target) {
            continue;
        }

        prop = con->PropertyName();
        break;
    }

    if(!target) {
        DOMWarning("failed to resolve target Model/NodeAttribute/Constraint for AnimationCurveNode",&element);
    }

    props = GetPropertyTable(doc,"AnimationCurveNode.FbxAnimCurveNode",element,sc,false);
}